

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O2

wchar_t lookup_feat_code(char *code)

{
  int iVar1;
  char **ppcVar2;
  long lVar3;
  
  ppcVar2 = feat_code_list;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x19) {
      return L'\xffffffff';
    }
    iVar1 = strcmp(code,*ppcVar2);
    if (iVar1 == 0) break;
    lVar3 = lVar3 + 1;
    ppcVar2 = ppcVar2 + 1;
  }
  return (wchar_t)lVar3;
}

Assistant:

int lookup_feat_code(const char *code)
{
	int i = 0;

	while (1) {
		assert(i >= 0 && i < (int) N_ELEMENTS(feat_code_list));
		if (!feat_code_list[i]) {
			return -1;
		}
		if (streq(code, feat_code_list[i])) {
			break;
		}
		++i;
	}
	return i;
}